

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O2

void __thiscall
duckdb::SampleGlobalSinkState::SampleGlobalSinkState
          (SampleGlobalSinkState *this,Allocator *allocator,SampleOptions *options)

{
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  int64_t val;
  double percentage;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_38;
  double local_30;
  idx_t local_28;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__SampleGlobalSinkState_017a0c98;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->sample).
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = (BlockingSample *)0x0;
  if (options->is_percentage == true) {
    local_30 = Value::GetValue<double>(&options->sample_size);
    if ((local_30 == 0.0) && (!NAN(local_30))) {
      return;
    }
    local_28 = optional_idx::GetIndex(&options->seed);
    make_uniq<duckdb::ReservoirSamplePercentage,duckdb::Allocator&,double&,long>
              ((duckdb *)&local_38,allocator,&local_30,(long *)&local_28);
  }
  else {
    val = Value::GetValue<long>(&options->sample_size);
    local_30 = (double)NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
    if (local_30 == 0.0) {
      return;
    }
    local_28 = optional_idx::GetIndex(&options->seed);
    make_uniq<duckdb::ReservoirSample,duckdb::Allocator&,unsigned_long&,long>
              ((duckdb *)&local_38,allocator,(unsigned_long *)&local_30,(long *)&local_28);
  }
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (BlockingSample *)0x0;
  _Var1._M_head_impl =
       (this->sample).
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  (this->sample).
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var2._M_head_impl;
  if ((_Var1._M_head_impl != (BlockingSample *)0x0) &&
     ((**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockingSample + 8))(),
     local_38._M_head_impl != (BlockingSample *)0x0)) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  return;
}

Assistant:

explicit SampleGlobalSinkState(Allocator &allocator, SampleOptions &options) {
		if (options.is_percentage) {
			auto percentage = options.sample_size.GetValue<double>();
			if (percentage == 0) {
				return;
			}
			sample = make_uniq<ReservoirSamplePercentage>(allocator, percentage,
			                                              static_cast<int64_t>(options.seed.GetIndex()));
		} else {
			auto size = NumericCast<idx_t>(options.sample_size.GetValue<int64_t>());
			if (size == 0) {
				return;
			}
			sample = make_uniq<ReservoirSample>(allocator, size, static_cast<int64_t>(options.seed.GetIndex()));
		}
	}